

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYElement::PLYElement(PLYElement *this,string *elem_name,long elem_size)

{
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::
  vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
  ::vector((vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
            *)0x143e75);
  *(undefined8 *)(in_RDI + 0x20) = in_RDX;
  return;
}

Assistant:

PLYElement::PLYElement(const std::string &elem_name, long elem_size): name(elem_name)
{
  size=elem_size;
}